

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroup::SetVersionInfo
          (RowGroup *this,shared_ptr<duckdb::RowVersionManager,_true> *version)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  RowVersionManager *__tmp;
  element_type *peVar2;
  
  peVar2 = (version->internal).
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (version->internal).
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (version->internal).super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (version->internal).super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  this_00 = (this->owned_version_info).internal.
            super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    peVar2 = (this->owned_version_info).internal.
             super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  LOCK();
  (this->version_info)._M_i.ptr = peVar2;
  UNLOCK();
  return;
}

Assistant:

void RowGroup::SetVersionInfo(shared_ptr<RowVersionManager> version) {
	owned_version_info = std::move(version);
	version_info = owned_version_info.get();
}